

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwrite.c
# Opt level: O2

size_t fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  char **mtx;
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  
  mtx = &__s->_IO_save_base;
  mtx_lock((mtx_t *)mtx);
  iVar2 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__s);
  if (iVar2 == -1) {
    mtx_unlock((mtx_t *)mtx);
    return 0;
  }
  pcVar5 = (char *)0x0;
  for (sVar4 = 0; sVar4 != __n; sVar4 = sVar4 + 1) {
    for (sVar7 = 0; __size != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = *(char *)((long)__ptr + sVar7);
      pcVar6 = __s->_IO_read_base;
      __s->_IO_read_base = pcVar6 + 1;
      __s->_IO_read_ptr[(long)pcVar6] = cVar1;
      if (cVar1 == '\n') {
        pcVar5 = __s->_IO_read_base;
      }
      if (__s->_IO_read_base == __s->_IO_read_end) {
        iVar2 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s);
        if (iVar2 == -1) {
          mtx_unlock((mtx_t *)mtx);
          return sVar4;
        }
        pcVar5 = (char *)0x0;
      }
    }
    __ptr = (void *)((long)__ptr + __size);
  }
  uVar3 = *(uint *)((long)&__s->_IO_buf_end + 4) & 6;
  if (uVar3 == 2) {
    if (pcVar5 != (char *)0x0) {
      pcVar6 = __s->_IO_read_base;
      __s->_IO_read_base = pcVar5;
      iVar2 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s);
      if (iVar2 == -1) {
        __s->_IO_read_base = pcVar6;
        goto LAB_00103820;
      }
      pcVar6 = pcVar6 + -(long)pcVar5;
      __s->_IO_read_base = pcVar6;
      memmove(__s->_IO_read_ptr,pcVar5 + (long)__s->_IO_read_ptr,(size_t)pcVar6);
    }
  }
  else if ((uVar3 == 4) && (iVar2 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s), iVar2 == -1)) {
LAB_00103820:
    mtx_unlock((mtx_t *)mtx);
    return __n - 1;
  }
  mtx_unlock((mtx_t *)mtx);
  return __n;
}

Assistant:

size_t fwrite( const void * _PDCLIB_restrict ptr, size_t size, size_t nmemb, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    _PDCLIB_size_t offset = 0;
    /* TODO: lineend */
    /* int lineend = 0; */
    size_t nmemb_i;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return 0;
    }

    for ( nmemb_i = 0; nmemb_i < nmemb; ++nmemb_i )
    {
        size_t size_i;

        for ( size_i = 0; size_i < size; ++size_i )
        {
            if ( ( stream->buffer[ stream->bufidx++ ] = ( ( char * )ptr )[ nmemb_i * size + size_i ] ) == '\n' )
            {
                /* Remember last newline, in case we have to do a partial line-buffered flush */
                offset = stream->bufidx;
                /* lineend = true; */
            }

            if ( stream->bufidx == stream->bufsize )
            {
                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    /* Returning number of objects completely buffered */
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i;
                }

                offset = 0;
                /* lineend = false; */
            }
        }
    }

    /* Fully-buffered streams are OK. Non-buffered streams must be flushed,
       line-buffered streams only if there's a newline in the buffer.
    */
    switch ( stream->status & ( _IONBF | _IOLBF ) )
    {
        case _IONBF:
            if ( _PDCLIB_flushbuffer( stream ) == EOF )
            {
                /* We are in a pinch here. We have an error, which requires a
                   return value < nmemb. On the other hand, all objects have
                   been written to buffer, which means all the caller had to
                   do was removing the error cause, and re-flush the stream...
                   Catch 22. We'll return a value one short, to indicate the
                   error, and can't really do anything about the inconsistency.
                */
                _PDCLIB_UNLOCK( stream->mtx );
                return nmemb_i - 1;
            }

            break;

        case _IOLBF:
            if ( offset > 0 )
            {
                size_t bufidx = stream->bufidx;
                stream->bufidx = offset;

                if ( _PDCLIB_flushbuffer( stream ) == EOF )
                {
                    /* See comment above. */
                    stream->bufidx = bufidx;
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i - 1;
                }

                stream->bufidx = bufidx - offset;
                memmove( stream->buffer, stream->buffer + offset, stream->bufidx );
            }
    }

    _PDCLIB_UNLOCK( stream->mtx );
    return nmemb_i;
}